

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_GetFloorTerrain
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  PClass *pPVar3;
  char *__assertion;
  undefined8 *puVar4;
  bool bVar5;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0042f632;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0042f5fa:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0042f632:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1780,
                  "int AF_AActor_GetFloorTerrain(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  puVar4 = (undefined8 *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (puVar4 == (undefined8 *)0x0) goto LAB_0042f5a4;
    pPVar3 = (PClass *)puVar4[1];
    if (pPVar3 == (PClass *)0x0) {
      pPVar3 = (PClass *)(**(code **)*puVar4)(puVar4);
      puVar4[1] = pPVar3;
    }
    bVar5 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar5) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar5) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0042f632;
    }
    iVar2 = *(int *)((long)puVar4 + 0x164);
    if (-1 < *(int *)((long)puVar4 + 0x164)) goto LAB_0042f5bf;
    puVar4 = puVar4 + 0x26;
  }
  else {
    if (puVar4 != (undefined8 *)0x0) goto LAB_0042f5fa;
LAB_0042f5a4:
    iVar2 = _DAT_00000164;
    if (-1 < _DAT_00000164) goto LAB_0042f5bf;
    puVar4 = (undefined8 *)&DAT_00000130;
  }
  iVar2 = sector_t::GetTerrain((sector_t_conflict *)*puVar4,0);
LAB_0042f5bf:
  if (numret < 1) {
    iVar2 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1781,
                    "int AF_AActor_GetFloorTerrain(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    VMReturn::SetPointer(ret,Terrains.Array + iVar2,0);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, GetFloorTerrain)
{
	PARAM_SELF_PROLOGUE(AActor);
	ACTION_RETURN_POINTER(&Terrains[P_GetThingFloorType(self)]);
}